

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

Slice __thiscall arangodb::velocypack::ObjectIterator::key(ObjectIterator *this,bool translate)

{
  uint8_t *puVar1;
  Slice SVar2;
  ulong uVar3;
  Slice s;
  byte *pbStack_20;
  uint8_t *local_8;
  
  if (this->_position == this->_size) {
    key();
    SVar2._start = (uint8_t *)this->_position;
    if (SVar2._start != (uint8_t *)this->_size) {
      SVar2._start = SVar2._start + 1;
      this->_position = (ValueLength)SVar2._start;
      pbStack_20 = this->_current;
      if (pbStack_20 != (byte *)0x0) {
        uVar3 = (ulong)"\x01\x01"[*pbStack_20];
        if (uVar3 == 0) {
          uVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_20,pbStack_20);
        }
        puVar1 = this->_current;
        pbStack_20 = puVar1 + uVar3;
        this->_current = pbStack_20;
        SVar2._start = (uint8_t *)(ulong)"\x01\x01"[puVar1[uVar3]];
        if (SVar2._start == (uint8_t *)0x0) {
          SVar2._start = (uint8_t *)
                         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                         byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                          *)&pbStack_20,pbStack_20);
        }
        this->_current = this->_current + SVar2._start;
      }
    }
    return (Slice)SVar2._start;
  }
  local_8 = this->_current;
  if (local_8 != (uint8_t *)0x0) {
    if (translate) {
      local_8 = (uint8_t *)
                SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::makeKey
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           &local_8);
    }
    return (Slice)local_8;
  }
  SVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthKey
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position,translate);
  return (Slice)SVar2._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }